

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O1

int av1_tpl_stats_ready(TplParams *tpl_data,int gf_frame_index)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((gf_frame_index < 0x60) && (tpl_data->ready != 0)) {
    uVar1 = (uint)tpl_data->tpl_frame[gf_frame_index].is_valid;
  }
  return uVar1;
}

Assistant:

int av1_tpl_stats_ready(const TplParams *tpl_data, int gf_frame_index) {
  if (tpl_data->ready == 0) {
    return 0;
  }
  if (gf_frame_index >= MAX_TPL_FRAME_IDX) {
    // The sub-GOP length exceeds the TPL buffer capacity.
    // Hence the TPL related functions are disabled hereafter.
    return 0;
  }
  return tpl_data->tpl_frame[gf_frame_index].is_valid;
}